

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FS.cpp
# Opt level: O0

int File::copy(string *from,string *to)

{
  char *__name;
  streambuf *psVar1;
  int iVar2;
  bool bVar3;
  ostream local_428 [8];
  ofstream dst;
  undefined1 local_228 [8];
  ifstream src;
  string *to_local;
  string *from_local;
  
  __name = (char *)std::__cxx11::string::c_str();
  iVar2 = access(__name,0);
  bVar3 = iVar2 == 0;
  if (bVar3) {
    std::ifstream::ifstream(local_228,(string *)from,_S_bin);
    std::ofstream::ofstream(local_428,(string *)to,_S_bin);
    psVar1 = (streambuf *)std::ifstream::rdbuf();
    std::ostream::operator<<(local_428,psVar1);
    std::ofstream::~ofstream(local_428);
    iVar2 = std::ifstream::~ifstream(local_228);
  }
  return CONCAT31((int3)((uint)iVar2 >> 8),bVar3);
}

Assistant:

bool File::copy (const std::string& from, const std::string& to)
{
  // 'from' must exist.
  if (! access (from.c_str (), F_OK))
  {
    std::ifstream src (from, std::ios::binary);
    std::ofstream dst (to,   std::ios::binary);

    dst << src.rdbuf ();
    return true;
  }

  return false;
}